

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void smfree(small_alloc *alloc,void *ptr,size_t size)

{
  small_stats *psVar1;
  uint uVar2;
  mempool *pool;
  small_mempool *psVar3;
  ulong uVar4;
  mslab *slab;
  
  psVar3 = small_mempool_search(alloc,size);
  if (psVar3 == (small_mempool *)0x0) {
    slab_put_large(alloc->cache,(slab *)((long)ptr + -0x30));
    return;
  }
  slab = (mslab *)((psVar3->pool).slab_ptr_mask & (ulong)ptr);
  if ((slab->slab).magic != 0xeec0ffee) {
    __assert_fail("slab->magic == slab_magic",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                  ,0xd1,"struct slab *slab_from_ptr(void *, intptr_t)");
  }
  pool = slab->mempool;
  uVar2 = pool->objsize;
  uVar4 = (ulong)(uVar2 - (psVar3->pool).objsize);
  if (psVar3->waste < uVar4) {
    __assert_fail("pool->waste >= slab->mempool->objsize - pool->pool.objsize",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                  ,399,"void smfree(struct small_alloc *, void *, size_t)");
  }
  psVar3->waste = psVar3->waste - uVar4;
  if (ptr != (void *)0x0) {
    memset(ptr,0x23,(ulong)uVar2);
    if ((slab->slab).order == pool->slab_order) {
      psVar1 = &(pool->slabs).stats;
      psVar1->used = psVar1->used - (ulong)pool->objsize;
      mslab_free(pool,slab,ptr);
      return;
    }
    __assert_fail("slab->slab.order == pool->slab_order",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                  ,0x12a,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                ,0x126,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
}

Assistant:

void
smfree(struct small_alloc *alloc, void *ptr, size_t size)
{
	struct small_mempool *pool = small_mempool_search(alloc, size);
	if (pool == NULL) {
		/* Large allocation by slab_cache */
		struct slab *slab = slab_from_data(ptr);
		slab_put_large(alloc->cache, slab);
		return;
	}

	struct mslab *slab = (struct mslab *)
		slab_from_ptr(ptr, pool->pool.slab_ptr_mask);
	/*
	 * In case this ptr was allocated from other small mempool
	 * reducing waste for current pool (as you remember, waste
	 * in our case is memory loss due to allocation from large pools).
	 */
	assert(pool->waste >= slab->mempool->objsize - pool->pool.objsize);
	pool->waste -= slab->mempool->objsize - pool->pool.objsize;
	/* Regular allocation in mempools */
	mempool_free_slab(slab->mempool, slab, ptr);
}